

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int idp_check_dp(DIST_POINT_NAME *a,DIST_POINT_NAME *b)

{
  int iVar1;
  size_t sVar2;
  GENERAL_NAME *pGVar3;
  GENERAL_NAME *a_00;
  GENERAL_NAME *b_00;
  ulong local_50;
  size_t j;
  size_t i;
  GENERAL_NAME *genb;
  GENERAL_NAME *gena;
  GENERAL_NAMES *gens;
  X509_NAME *nm;
  DIST_POINT_NAME *b_local;
  DIST_POINT_NAME *a_local;
  
  gens = (GENERAL_NAMES *)0x0;
  gena = (GENERAL_NAME *)0x0;
  if ((a == (DIST_POINT_NAME *)0x0) || (b == (DIST_POINT_NAME *)0x0)) {
    return 1;
  }
  if (a->type == 1) {
    if (a->dpname == (X509_NAME *)0x0) {
      return 0;
    }
    if (b->type == 1) {
      if (b->dpname == (X509_NAME *)0x0) {
        return 0;
      }
      iVar1 = X509_NAME_cmp((X509_NAME *)a->dpname,(X509_NAME *)b->dpname);
      if (iVar1 != 0) {
        return 0;
      }
      return 1;
    }
    gens = (GENERAL_NAMES *)a->dpname;
    gena = (GENERAL_NAME *)(b->name).fullname;
  }
  else if (b->type == 1) {
    if (b->dpname == (X509_NAME *)0x0) {
      return 0;
    }
    gena = (GENERAL_NAME *)(a->name).fullname;
    gens = (GENERAL_NAMES *)b->dpname;
  }
  if (gens == (GENERAL_NAMES *)0x0) {
    for (j = 0; sVar2 = sk_GENERAL_NAME_num((a->name).fullname), j < sVar2; j = j + 1) {
      a_00 = (GENERAL_NAME *)sk_GENERAL_NAME_value((a->name).fullname,j);
      for (local_50 = 0; sVar2 = sk_GENERAL_NAME_num((b->name).fullname), local_50 < sVar2;
          local_50 = local_50 + 1) {
        b_00 = (GENERAL_NAME *)sk_GENERAL_NAME_value((b->name).fullname,local_50);
        iVar1 = GENERAL_NAME_cmp(a_00,b_00);
        if (iVar1 == 0) {
          return 1;
        }
      }
    }
  }
  else {
    for (j = 0; sVar2 = sk_GENERAL_NAME_num((stack_st_GENERAL_NAME *)gena), j < sVar2; j = j + 1) {
      pGVar3 = sk_GENERAL_NAME_value((stack_st_GENERAL_NAME *)gena,j);
      if ((pGVar3->type == 4) &&
         (iVar1 = X509_NAME_cmp((X509_NAME *)gens,(X509_NAME *)(pGVar3->d).otherName), iVar1 == 0))
      {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int idp_check_dp(DIST_POINT_NAME *a, DIST_POINT_NAME *b) {
  X509_NAME *nm = NULL;
  GENERAL_NAMES *gens = NULL;
  GENERAL_NAME *gena, *genb;
  size_t i, j;
  if (!a || !b) {
    return 1;
  }
  if (a->type == 1) {
    if (!a->dpname) {
      return 0;
    }
    // Case 1: two X509_NAME
    if (b->type == 1) {
      if (!b->dpname) {
        return 0;
      }
      if (!X509_NAME_cmp(a->dpname, b->dpname)) {
        return 1;
      } else {
        return 0;
      }
    }
    // Case 2: set name and GENERAL_NAMES appropriately
    nm = a->dpname;
    gens = b->name.fullname;
  } else if (b->type == 1) {
    if (!b->dpname) {
      return 0;
    }
    // Case 2: set name and GENERAL_NAMES appropriately
    gens = a->name.fullname;
    nm = b->dpname;
  }

  // Handle case 2 with one GENERAL_NAMES and one X509_NAME
  if (nm) {
    for (i = 0; i < sk_GENERAL_NAME_num(gens); i++) {
      gena = sk_GENERAL_NAME_value(gens, i);
      if (gena->type != GEN_DIRNAME) {
        continue;
      }
      if (!X509_NAME_cmp(nm, gena->d.directoryName)) {
        return 1;
      }
    }
    return 0;
  }

  // Else case 3: two GENERAL_NAMES

  for (i = 0; i < sk_GENERAL_NAME_num(a->name.fullname); i++) {
    gena = sk_GENERAL_NAME_value(a->name.fullname, i);
    for (j = 0; j < sk_GENERAL_NAME_num(b->name.fullname); j++) {
      genb = sk_GENERAL_NAME_value(b->name.fullname, j);
      if (!GENERAL_NAME_cmp(gena, genb)) {
        return 1;
      }
    }
  }

  return 0;
}